

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O3

char __thiscall TextProviderString::peek_next(TextProviderString *this)

{
  pointer pcVar1;
  _Storage<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Var2;
  element_type *peVar3;
  int iVar4;
  ulong uVar5;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  if ((this->m_iterator).
      super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged == false) {
    peVar3 = (this->super_TextProvider).m_logger.
             super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_dataplus._M_p,
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_dataplus._M_p +
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_string_length);
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_60,
               "Cannot yet use peek before a first advance with the textProviderString, sorry :/",""
              );
    (*peVar3->_vptr_PSLogger[2])(peVar3,4,local_40,local_60);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    (this->super_TextProvider).m_has_error = true;
  }
  else {
    pcVar1 = (this->m_text)._M_dataplus._M_p;
    _Var2 = (this->m_iterator).
            super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload;
    iVar4 = (*(this->super_TextProvider)._vptr_TextProvider[2])(this);
    if (((char)iVar4 != '\0') &&
       (uVar5 = (ulong)((_Var2._0_4_ - (int)pcVar1) + 2), uVar5 < (this->m_text)._M_string_length))
    {
      return (this->m_text)._M_dataplus._M_p[uVar5];
    }
  }
  return '\0';
}

Assistant:

char TextProviderString::peek_next()
{
	if( !m_iterator.has_value())
	{
		m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat,
			"Cannot yet use peek before a first advance with the textProviderString, sorry :/");
		m_has_error = true;
		return '\0';
	}

	int peeked_at_index = (int)(m_iterator.value() - m_text.begin()) + 2;

	if(is_valid() && peeked_at_index < m_text.size())
	{
		return m_text.at(peeked_at_index);
	}
	else
	{
		return '\0';
	}
}